

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::TablePackSignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,StructDef *struct_def,bool inclass,
          IDLOptions *opts)

{
  char *pcVar1;
  string local_2b8;
  string local_298;
  string local_278;
  byte local_251;
  string local_250;
  byte local_22a;
  allocator<char> local_229;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  allocator<char> local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IDLOptions *local_30;
  IDLOptions *opts_local;
  StructDef *pSStack_20;
  bool inclass_local;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  pcVar1 = "";
  if (inclass) {
    pcVar1 = "static ";
  }
  local_30 = opts;
  opts_local._7_1_ = inclass;
  pSStack_20 = struct_def;
  struct_def_local = (StructDef *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,pcVar1,&local_1d1);
  std::operator+(&local_1b0,&local_1d0,"::flatbuffers::Offset<");
  Name_abi_cxx11_(&local_208,this,&pSStack_20->super_Definition);
  std::operator+(&local_190,&local_1b0,&local_208);
  std::operator+(&local_170,&local_190,"> ");
  local_22a = 0;
  local_251 = 0;
  if ((opts_local._7_1_ & 1) == 0) {
    Name_abi_cxx11_(&local_250,this,&pSStack_20->super_Definition);
    local_251 = 1;
    std::operator+(&local_228,&local_250,"::");
  }
  else {
    std::allocator<char>::allocator();
    local_22a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"",&local_229);
  }
  std::operator+(&local_150,&local_170,&local_228);
  std::operator+(&local_130,&local_150,"Pack(");
  GetBuilder_abi_cxx11_(&local_278,this);
  std::operator+(&local_110,&local_130,&local_278);
  std::operator+(&local_f0,&local_110," &_fbb, ");
  std::operator+(&local_d0,&local_f0,"const ");
  Name_abi_cxx11_(&local_2b8,this,&pSStack_20->super_Definition);
  NativeName(&local_298,&local_2b8,pSStack_20,local_30);
  std::operator+(&local_b0,&local_d0,&local_298);
  std::operator+(&local_90,&local_b0,"* _o, ");
  std::operator+(&local_70,&local_90,"const ::flatbuffers::rehasher_function_t *_rehasher");
  pcVar1 = "";
  if ((opts_local._7_1_ & 1) != 0) {
    pcVar1 = " = nullptr";
  }
  std::operator+(&local_50,&local_70,pcVar1);
  std::operator+(__return_storage_ptr__,&local_50,")");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_228);
  if ((local_251 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_250);
  }
  if ((local_22a & 1) != 0) {
    std::allocator<char>::~allocator(&local_229);
  }
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  return __return_storage_ptr__;
}

Assistant:

std::string TablePackSignature(const StructDef &struct_def, bool inclass,
                                 const IDLOptions &opts) {
    return std::string(inclass ? "static " : "") + "::flatbuffers::Offset<" +
           Name(struct_def) + "> " + (inclass ? "" : Name(struct_def) + "::") +
           "Pack(" + GetBuilder() + " &_fbb, " + "const " +
           NativeName(Name(struct_def), &struct_def, opts) + "* _o, " +
           "const ::flatbuffers::rehasher_function_t *_rehasher" +
           (inclass ? " = nullptr" : "") + ")";
  }